

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O3

FISoundChannel * S_GetChannel(void *syschan)

{
  FSoundChan *pFVar1;
  FSoundChan *pFVar2;
  
  pFVar2 = FreeChannels;
  if (FreeChannels == (FSoundChan *)0x0) {
    pFVar2 = (FSoundChan *)operator_new(0x68);
    (pFVar2->super_FISoundChannel).SysChannel = (void *)0x0;
    (pFVar2->super_FISoundChannel).StartTime.AsOne = 0;
    (pFVar2->super_FISoundChannel).Rolloff.RolloffType = 0;
    (pFVar2->super_FISoundChannel).Rolloff.MinDistance = 0.0;
    *(undefined8 *)&(pFVar2->super_FISoundChannel).Rolloff.field_2 = 0;
    (pFVar2->super_FISoundChannel).DistanceSqr = 0.0;
    (pFVar2->super_FISoundChannel).ManualRolloff = false;
    *(undefined3 *)&(pFVar2->super_FISoundChannel).field_0x25 = 0;
    pFVar2->NextChan = (FSoundChan *)0x0;
    pFVar2->PrevChan = (FSoundChan **)0x0;
    pFVar2->SoundID = 0;
    pFVar2->OrgID = 0;
    pFVar2->Volume = 0.0;
    pFVar2->ChanFlags = 0;
    pFVar2->Pitch = 0;
    pFVar2->EntChannel = '\0';
    pFVar2->Priority = '\0';
    pFVar2->NearLimit = 0;
    pFVar2->SourceType = '\0';
    pFVar2->field_0x4f = 0;
    *(undefined8 *)&pFVar2->LimitRange = 0;
    (pFVar2->field_12).Actor = (AActor *)0x0;
    *(undefined8 *)((long)&pFVar2->field_12 + 8) = 0;
  }
  else {
    pFVar1 = FreeChannels->NextChan;
    *FreeChannels->PrevChan = pFVar1;
    if (pFVar1 != (FSoundChan *)0x0) {
      pFVar1->PrevChan = pFVar2->PrevChan;
    }
  }
  pFVar2->NextChan = Channels;
  if (Channels != (FSoundChan *)0x0) {
    Channels->PrevChan = &pFVar2->NextChan;
  }
  Channels = pFVar2;
  pFVar2->PrevChan = &Channels;
  (pFVar2->super_FISoundChannel).SysChannel = syschan;
  return &pFVar2->super_FISoundChannel;
}

Assistant:

FISoundChannel *S_GetChannel(void *syschan)
{
	FSoundChan *chan;

	if (FreeChannels != NULL)
	{
		chan = FreeChannels;
		S_UnlinkChannel(chan);
	}
	else
	{
		chan = new FSoundChan;
		memset(chan, 0, sizeof(*chan));
	}
	S_LinkChannel(chan, &Channels);
	chan->SysChannel = syschan;
	return chan;
}